

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * __thiscall
cmdline::parser::option_with_value<int>::short_description_abi_cxx11_
          (string *__return_storage_ptr__,option_with_value<int> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  option_with_value<int> *local_18;
  option_with_value<int> *this_local;
  
  local_18 = this;
  this_local = (option_with_value<int> *)__return_storage_ptr__;
  std::operator+(&local_58,"--",&this->nam);
  std::operator+(&local_38,&local_58,"=");
  detail::readable_typename<int>();
  std::operator+(__return_storage_ptr__,&local_38,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string short_description() const{
                        return "--" + nam + "=" + detail::readable_typename<T>();
                    }